

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.cpp
# Opt level: O3

vss * Search::generalSearch
                (vss *__return_storage_ptr__,Problem *problem,int iterationLimit,int fringeSize,
                bool isRandomInitialize,int expanderCode,int completenessCode)

{
  pointer pSVar1;
  bool bVar2;
  ostream *poVar3;
  long *plVar4;
  vector<State,_std::allocator<State>_> *pvVar5;
  State *pSVar6;
  vector<State,_std::allocator<State>_> *pvVar7;
  int iVar8;
  State *pSVar9;
  State randomState;
  vector<State,_std::allocator<State>_> fringe;
  int local_16c;
  vector<State,_std::allocator<State>_> local_158;
  string local_138;
  State local_118;
  vss *local_f0;
  vector<State,_std::allocator<State>_> local_e8;
  vector<State,_std::allocator<State>_> local_d0;
  vector<State,_std::allocator<State>_> local_b8;
  vector<State,_std::allocator<State>_> local_a0;
  vector<State,_std::allocator<State>_> local_88;
  State local_70;
  vector<State,_std::allocator<State>_> local_48;
  
  local_f0 = __return_storage_ptr__;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Entered general search",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  local_e8.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e8.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_158.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_158.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_158.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Problem::clearValidStore(problem);
  if (isRandomInitialize) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Random initialization",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    if (0 < fringeSize) {
      iVar8 = fringeSize;
      do {
        Problem::generateRandomState(&local_118,problem);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"State: ",7);
        std::vector<int,_std::allocator<int>_>::vector(&local_70.bidNumbers,&local_118.bidNumbers);
        local_70.numConflicts = local_118.numConflicts;
        local_70.cost = local_118.cost;
        Problem::getStringFromState_abi_cxx11_(&local_138,problem,&local_70);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_138._M_dataplus._M_p,
                            local_138._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if (local_70.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_70.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::vector<State,_std::allocator<State>_>::push_back(&local_e8,&local_118);
        if ((pointer)local_118.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
        }
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
  }
  else {
    Problem::getInitialState(&local_118,problem);
    std::vector<State,_std::allocator<State>_>::emplace_back<State>(&local_e8,&local_118);
    if ((pointer)local_118.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (1 < fringeSize) {
      iVar8 = fringeSize + -1;
      do {
        Problem::generateRandomState(&local_118,problem);
        std::vector<State,_std::allocator<State>_>::push_back(&local_e8,&local_118);
        if ((pointer)local_118.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
        }
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initialized fringe",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  local_16c = 0;
  if (iterationLimit < 1) {
    iterationLimit = 0;
  }
LAB_00106949:
  std::vector<State,_std::allocator<State>_>::vector(&local_48,&local_e8);
  Problem::fringeExpander
            ((vector<State,_std::allocator<State>_> *)&local_138,problem,&local_48,fringeSize,0);
  local_118.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage =
       (pointer)local_158.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_118.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)local_158.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                        super__Vector_impl_data._M_finish;
  local_118.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_158.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                       super__Vector_impl_data._M_start;
  local_158.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_138.field_2._M_allocated_capacity;
  local_158.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_138._M_dataplus._M_p;
  local_158.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_138._M_string_length;
  local_138._M_dataplus._M_p = (pointer)0x0;
  local_138._M_string_length = 0;
  local_138.field_2._M_allocated_capacity = 0;
  std::vector<State,_std::allocator<State>_>::~vector
            ((vector<State,_std::allocator<State>_> *)&local_118);
  std::vector<State,_std::allocator<State>_>::~vector
            ((vector<State,_std::allocator<State>_> *)&local_138);
  std::vector<State,_std::allocator<State>_>::~vector(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Computed new fringe",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  if (local_16c == iterationLimit) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Exceeded max iterations",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
LAB_00106c07:
    Problem::getValidStore(local_f0,problem);
    std::vector<State,_std::allocator<State>_>::~vector(&local_158);
    std::vector<State,_std::allocator<State>_>::~vector(&local_e8);
    return local_f0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Iteration: ",0xb);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_16c);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if (completenessCode != 0) {
    std::vector<State,_std::allocator<State>_>::vector(&local_b8,&local_e8);
    std::vector<State,_std::allocator<State>_>::vector(&local_d0,&local_158);
    pSVar1 = local_d0.super__Vector_base<State,_std::allocator<State>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar6 = local_d0.super__Vector_base<State,_std::allocator<State>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar9 = local_b8.super__Vector_base<State,_std::allocator<State>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (pSVar6 == pSVar1) {
        pvVar5 = &local_b8;
        pvVar7 = &local_d0;
LAB_00106bb4:
        std::vector<State,_std::allocator<State>_>::~vector(pvVar7);
        std::vector<State,_std::allocator<State>_>::~vector(pvVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Reached Local maxima",0x14);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
        std::ostream::put(-0x40);
        std::ostream::flush();
        goto LAB_00106c07;
      }
      bVar2 = State::operator==(pSVar6,pSVar9);
      if (!bVar2) goto LAB_00106b33;
      pSVar6 = pSVar6 + 1;
      pSVar9 = pSVar9 + 1;
    } while( true );
  }
  std::vector<State,_std::allocator<State>_>::vector(&local_88,&local_e8);
  std::vector<State,_std::allocator<State>_>::vector(&local_a0,&local_158);
  pSVar1 = local_a0.super__Vector_base<State,_std::allocator<State>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar6 = local_a0.super__Vector_base<State,_std::allocator<State>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar9 = local_88.super__Vector_base<State,_std::allocator<State>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (pSVar6 == pSVar1) {
      pvVar7 = &local_a0;
      pvVar5 = &local_88;
      goto LAB_00106bb4;
    }
    bVar2 = State::operator==(pSVar6,pSVar9);
    if (!bVar2) break;
    pSVar6 = pSVar6 + 1;
    pSVar9 = pSVar9 + 1;
  }
  pvVar5 = &local_a0;
  pvVar7 = &local_88;
  goto LAB_00106b60;
LAB_00106b33:
  pvVar5 = &local_d0;
  pvVar7 = &local_b8;
LAB_00106b60:
  std::vector<State,_std::allocator<State>_>::~vector(pvVar5);
  std::vector<State,_std::allocator<State>_>::~vector(pvVar7);
  std::vector<State,_std::allocator<State>_>::operator=(&local_e8,&local_158);
  local_16c = local_16c + 1;
  goto LAB_00106949;
}

Assistant:

vss Search::generalSearch(Problem *problem, int iterationLimit, int fringeSize, bool isRandomInitialize,
                          int expanderCode, int completenessCode) {
    cout<<"Entered general search"<<endl;
    vector<State> fringe;
    vector<State> newfringe;
    problem->clearValidStore();

    // Initialize fringe
    if (isRandomInitialize) {
        cout<<"Random initialization"<<endl;
        for (int i = 0; i < fringeSize; ++i) {
            State randomState = problem->generateRandomState();
            cout<<"State: "<<problem->getStringFromState(randomState)<<endl;
            fringe.push_back(randomState);
        }
    }
    else {
        fringe.push_back(problem->getInitialState());
        for (int i = 0; i < fringeSize - 1; ++i) {
            State randomState = problem->generateRandomState();
            fringe.push_back(randomState);
        }
    }
    cout<<"Initialized fringe"<<endl;

    int iterationCount = 0;
    bool run = true;

    while (run) {
        newfringe = problem->fringeExpander(fringe, fringeSize, 0);
        cout<<"Computed new fringe"<<endl;

        // Check if search is complete
        if (iterationCount >= iterationLimit) {
            run = false;
            cout << "Exceeded max iterations" << endl;
            break;
        }

        cout<<"Iteration: "<<iterationCount<<endl;
        // cout<<"Best state: "<<problem->getStringFromState(newfringe[0])<<endl;

        bool isComplete;

        /*
         * Codes for completeness checking functions
         * 0 : terminate if local maximum found
         */
        switch (completenessCode) {
            case 0:
                isComplete = isCompleteLocalMaximum(fringe, newfringe);
                break;
            default:
                isComplete = isCompleteLocalMaximum(fringe, newfringe);
        }
        if (isComplete) {
            run = false;
            cout << "Reached Local maxima" << endl;
            break;
        }

        fringe = newfringe;
        iterationCount++;
    }

    return problem->getValidStore();

}